

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O1

void nn_aws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  nn_ep *self_01;
  uint8_t msg_type;
  int errnum;
  int val;
  size_t sz;
  undefined4 local_3c;
  size_t local_38;
  
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].shutdown_fn);
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
    }
    else {
LAB_0013e4c7:
      nn_aws_handler_cold_12();
    }
    nn_aws_handler_cold_13();
  default:
    nn_aws_handler_cold_14();
LAB_0013e4d8:
    nn_aws_handler_cold_11();
LAB_0013e4dd:
    nn_aws_handler_cold_2();
LAB_0013e4e4:
    nn_aws_handler_cold_6();
LAB_0013e4eb:
    nn_aws_handler_cold_4();
    break;
  case 2:
    if (src == 3) {
      if (type == 6) {
        self_01 = (nn_ep *)self[1].shutdown_fn;
        errnum = nn_usock_geterrno((nn_usock *)self[8].shutdown_fn);
        nn_ep_set_error(self_01,errnum);
        nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x6b,1);
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].shutdown_fn);
        return;
      }
      goto LAB_0013e4f9;
    }
    if (src != 1) goto LAB_0013e4d8;
    if (type == 2) {
      nn_ep_clear_error((nn_ep *)self[1].shutdown_fn);
      local_38 = 4;
      nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,2,&local_3c,&local_38);
      if (local_38 == 4) {
        self_00 = &self[1].state;
        nn_usock_setsockopt((nn_usock *)self_00,1,7,&local_3c,4);
        local_38 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,3,&local_3c,&local_38);
        if (local_38 == 4) {
          nn_usock_setsockopt((nn_usock *)self_00,1,8,&local_3c,4);
          local_38 = 4;
          nn_ep_getopt((nn_ep *)self[1].shutdown_fn,-4,1,&local_3c,&local_38);
          msg_type = (uint8_t)local_3c;
          local_3c = 0;
          local_38 = 4;
          nn_usock_setsockopt((nn_usock *)self_00,1,0x14,&local_3c,4);
          nn_usock_swap_owner((nn_usock *)self[8].shutdown_fn,(nn_fsm_owner *)&self[8].state);
          self[8].shutdown_fn = (nn_fsm_fn)0x0;
          self[8].state = -1;
          self[8].srcptr = (void *)0x0;
          nn_fsm_raise(self,(nn_fsm_event *)&self[0x4e].stopped.item,0x85b7);
          nn_usock_activate((nn_usock *)self_00);
          nn_sws_start((nn_sws *)&self[8].owner,(nn_usock *)self_00,2,(char *)0x0,(char *)0x0,
                       msg_type);
          *(undefined4 *)&self[1].fn = 3;
          nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x66,1);
          return;
        }
      }
      else {
        nn_aws_handler_cold_9();
      }
      nn_aws_handler_cold_10();
      goto LAB_0013e4b8;
    }
    break;
  case 3:
    if (src != 2) {
LAB_0013e4bd:
      nn_aws_handler_cold_5();
LAB_0013e4c2:
      nn_aws_handler_cold_3();
      goto LAB_0013e4c7;
    }
    if (type == 1) {
      nn_sws_stop((nn_sws *)&self[8].owner);
      *(undefined4 *)&self[1].fn = 4;
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x68,1);
      return;
    }
    if (type == 2) {
      nn_sws_stop((nn_sws *)&self[8].owner);
      *(undefined4 *)&self[1].fn = 4;
      return;
    }
    goto LAB_0013e4e4;
  case 4:
    if (src != 2) goto LAB_0013e4c2;
    if (type == 8) {
      return;
    }
    if (type == 3) {
      nn_usock_stop((nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 5;
      return;
    }
    goto LAB_0013e4eb;
  case 5:
    if (src != 1) {
LAB_0013e4b8:
      nn_aws_handler_cold_1();
      goto LAB_0013e4bd;
    }
    if (type == 8) {
      return;
    }
    if (type == 7) {
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x4f].owner,0x85b8);
      *(undefined4 *)&self[1].fn = 6;
      return;
    }
    goto LAB_0013e4dd;
  }
  nn_aws_handler_cold_8();
LAB_0013e4f9:
  nn_aws_handler_cold_7();
}

Assistant:

static void nn_aws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aws *aws;
    int val;
    size_t sz;
    uint8_t msg_type;

    aws = nn_cont (self, struct nn_aws, fsm);

    switch (aws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_AWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&aws->usock, aws->listener);
                aws->state = NN_AWS_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_AWS_STATE_ACCEPTING:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_ep_clear_error (aws->ep);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_ep_getopt (aws->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (aws->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (aws->ep, NN_WS, NN_WS_MSG_TYPE, &val, &sz);
                msg_type = (uint8_t)val;

                /*   Since the WebSocket handshake must poll, the receive
                     timeout is set to zero. Later, it will be set again
                     to the value specified by the socket option. */
                val = 0;
                sz = sizeof (val);
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVTIMEO,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (aws->listener, &aws->listener_owner);
                aws->listener = NULL;
                aws->listener_owner.src = -1;
                aws->listener_owner.fsm = NULL;
                nn_fsm_raise (&aws->fsm, &aws->accepted, NN_AWS_ACCEPTED);

                /*  Start the sws state machine. */
                nn_usock_activate (&aws->usock);
                nn_sws_start (&aws->sws, &aws->usock, NN_WS_SERVER,
                    NULL, NULL, msg_type);
                aws->state = NN_AWS_STATE_ACTIVE;

                nn_ep_stat_increment (aws->ep, NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        case NN_AWS_SRC_LISTENER:
            switch (type) {

            case NN_USOCK_ACCEPT_ERROR:
                nn_ep_set_error (aws->ep, nn_usock_geterrno (aws->listener));
                nn_ep_stat_increment (aws->ep, NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&aws->usock, aws->listener);
                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_AWS_STATE_ACTIVE:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_SWS_RETURN_CLOSE_HANDSHAKE:
                /*  Peer closed connection without intention to reconnect, or
                    local endpoint failed remote because of invalid data. */
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                return;
            case NN_SWS_RETURN_ERROR:
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                nn_ep_stat_increment (aws->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SWS state.                                                       */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_SWS:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SWS_RETURN_STOPPED:
                nn_usock_stop (&aws->usock);
                aws->state = NN_AWS_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_fsm_raise (&aws->fsm, &aws->done, NN_AWS_ERROR);
                aws->state = NN_AWS_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (aws->state, src, type);
    }
}